

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O2

void __thiscall TCPConnection::Write(TCPConnection *this,uint8_t *data,uint16_t length)

{
  uint16_t *puVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  DataBuffer *pDVar4;
  ulong uVar5;
  ushort uVar6;
  
  do {
    while( true ) {
      if (length == 0) {
        return;
      }
      pDVar4 = this->TxBuffer;
      if (pDVar4 == (DataBuffer *)0x0) break;
LAB_001074f8:
      uVar6 = pDVar4->Remainder;
      if (length < uVar6) {
        for (uVar5 = 0; length != uVar5; uVar5 = uVar5 + 1) {
          uVar2 = data[uVar5];
          puVar3 = this->TxBuffer->Packet;
          uVar6 = this->TxOffset;
          this->TxOffset = uVar6 + 1;
          puVar3[uVar6] = uVar2;
        }
        pDVar4 = this->TxBuffer;
        puVar1 = &pDVar4->Length;
        *puVar1 = *puVar1 + length;
        puVar1 = &pDVar4->Remainder;
        *puVar1 = *puVar1 - length;
        return;
      }
      for (uVar5 = 0; uVar5 < uVar6; uVar5 = uVar5 + 1) {
        uVar2 = data[uVar5];
        puVar3 = pDVar4->Packet;
        uVar6 = this->TxOffset;
        this->TxOffset = uVar6 + 1;
        puVar3[uVar6] = uVar2;
        pDVar4 = this->TxBuffer;
        uVar6 = pDVar4->Remainder;
      }
      pDVar4->Length = pDVar4->Length + uVar6;
      length = length - uVar6;
      data = data + uVar6;
      pDVar4->Remainder = 0;
      Flush(this);
    }
    pDVar4 = GetTxBuffer(this);
    this->TxBuffer = pDVar4;
    this->TxOffset = 0;
    if (pDVar4 != (DataBuffer *)0x0) goto LAB_001074f8;
    puts("Out of tx buffers");
  } while( true );
}

Assistant:

void TCPConnection::Write(const uint8_t* data, uint16_t length)
{
    uint16_t i;

    while (length > 0)
    {
        if (!TxBuffer)
        {
            TxBuffer = GetTxBuffer();
            TxOffset = 0;
        }

        if (TxBuffer)
        {
            if (TxBuffer->Remainder > length)
            {
                for (i = 0; i < length; i++)
                {
                    TxBuffer->Packet[TxOffset++] = data[i];
                }
                TxBuffer->Length += length;
                TxBuffer->Remainder -= length;
                break;
            }
            else if (TxBuffer->Remainder <= length)
            {
                for (i = 0; i < TxBuffer->Remainder; i++)
                {
                    TxBuffer->Packet[TxOffset++] = data[i];
                }
                TxBuffer->Length += TxBuffer->Remainder;
                length -= TxBuffer->Remainder;
                data += TxBuffer->Remainder;
                TxBuffer->Remainder = 0;
                Flush();
            }
        }
        else
        {
            printf("Out of tx buffers\n");
        }
    }
}